

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

int Imf_3_3::numLinesInBuffer(Compression comp)

{
  int iVar1;
  int iVar2;
  ArgExc *this;
  char *text;
  exr_compression_t in_EDI;
  int numScanlines;
  char *in_stack_ffffffffffffffd8;
  ArgExc *in_stack_ffffffffffffffe0;
  
  iVar1 = getCompressionNumScanlines(in_EDI);
  iVar2 = exr_compression_lines_per_chunk(in_EDI);
  if (iVar2 != iVar1) {
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(this,in_stack_ffffffffffffffd8);
    __cxa_throw(this,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  if (iVar1 < 1) {
    text = (char *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(in_stack_ffffffffffffffe0,text);
    __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  return iVar1;
}

Assistant:

int
numLinesInBuffer (Compression comp)
{
    int numScanlines = getCompressionNumScanlines (comp);
    if (exr_compression_lines_per_chunk ((exr_compression_t)comp) != numScanlines)
        throw IEX_NAMESPACE::ArgExc ("Mismatch in compression lines per chunk");
    if (numScanlines < 1)
        throw IEX_NAMESPACE::ArgExc ("Unknown compression type");
    return numScanlines;
}